

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::ConfidentialTransactionContext::GetTxInIndex
          (ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  uint32_t uVar1;
  Txid local_30;
  
  core::OutPoint::GetTxid(&local_30,outpoint);
  uVar1 = core::OutPoint::GetVout(outpoint);
  uVar1 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
            _vptr_AbstractTransaction[2])(this,&local_30,(ulong)uVar1);
  core::Txid::~Txid(&local_30);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransactionContext::GetTxInIndex(
    const OutPoint& outpoint) const {
  return GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}